

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solverational.hpp
# Opt level: O1

void __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::_storeBasisAsOldBasis
          (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                 *rows,
          DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
          *cols)

{
  int iVar1;
  Verbosity VVar2;
  Verbosity old_verbosity;
  
  iVar1 = this->_certificateMode;
  if (iVar1 == 2) {
    VVar2 = (this->spxout).m_verbosity;
    if (2 < (int)VVar2) {
      (this->spxout).m_verbosity = INFO1;
      std::__ostream_insert<char,std::char_traits<char>>
                ((this->spxout).m_streams[3],
                 "Store basis as old basis (from solver - testing unboundedness)",0x3e);
      std::__ostream_insert<char,std::char_traits<char>>
                ((this->spxout).m_streams[(this->spxout).m_verbosity],"\n",1);
      (this->spxout).m_verbosity = VVar2;
    }
    if (&this->_oldUnbdBasisStatusRows != rows) {
      DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
      ::reSize(&this->_oldUnbdBasisStatusRows,rows->thesize);
      memcpy((this->_oldUnbdBasisStatusRows).data,rows->data,
             (ulong)(uint)(this->_oldUnbdBasisStatusRows).thesize << 2);
    }
    if (&this->_oldUnbdBasisStatusCols != cols) {
      DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
      ::reSize(&this->_oldUnbdBasisStatusCols,cols->thesize);
      memcpy((this->_oldUnbdBasisStatusCols).data,cols->data,
             (ulong)(uint)(this->_oldUnbdBasisStatusCols).thesize << 2);
    }
    this->_hasOldUnbdBasis = true;
  }
  else if (iVar1 == 1) {
    VVar2 = (this->spxout).m_verbosity;
    if (2 < (int)VVar2) {
      (this->spxout).m_verbosity = INFO1;
      std::__ostream_insert<char,std::char_traits<char>>
                ((this->spxout).m_streams[3],
                 "Store basis as old basis (from solver - testing feasibility)",0x3c);
      std::__ostream_insert<char,std::char_traits<char>>
                ((this->spxout).m_streams[(this->spxout).m_verbosity],"\n",1);
      (this->spxout).m_verbosity = VVar2;
    }
    if (&this->_oldFeasBasisStatusRows != rows) {
      DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
      ::reSize(&this->_oldFeasBasisStatusRows,rows->thesize);
      memcpy((this->_oldFeasBasisStatusRows).data,rows->data,
             (ulong)(uint)(this->_oldFeasBasisStatusRows).thesize << 2);
    }
    if (&this->_oldFeasBasisStatusCols != cols) {
      DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
      ::reSize(&this->_oldFeasBasisStatusCols,cols->thesize);
      memcpy((this->_oldFeasBasisStatusCols).data,cols->data,
             (ulong)(uint)(this->_oldFeasBasisStatusCols).thesize << 2);
    }
    this->_hasOldFeasBasis = true;
  }
  else if (iVar1 == 0) {
    VVar2 = (this->spxout).m_verbosity;
    if (2 < (int)VVar2) {
      (this->spxout).m_verbosity = INFO1;
      std::__ostream_insert<char,std::char_traits<char>>
                ((this->spxout).m_streams[3],"Store basis as old basis (from solver)",0x26);
      std::__ostream_insert<char,std::char_traits<char>>
                ((this->spxout).m_streams[(this->spxout).m_verbosity],"\n",1);
      (this->spxout).m_verbosity = VVar2;
    }
    if (&this->_oldBasisStatusRows != rows) {
      DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
      ::reSize(&this->_oldBasisStatusRows,rows->thesize);
      memcpy((this->_oldBasisStatusRows).data,rows->data,
             (ulong)(uint)(this->_oldBasisStatusRows).thesize << 2);
    }
    if (&this->_oldBasisStatusCols != cols) {
      DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
      ::reSize(&this->_oldBasisStatusCols,cols->thesize);
      memcpy((this->_oldBasisStatusCols).data,cols->data,
             (ulong)(uint)(this->_oldBasisStatusCols).thesize << 2);
    }
    this->_hasOldBasis = true;
  }
  return;
}

Assistant:

void SoPlexBase<R>::_storeBasisAsOldBasis(DataArray< typename SPxSolverBase<R>::VarStatus >& rows,
      DataArray< typename SPxSolverBase<R>::VarStatus >& cols)
{
   if(_inStandardMode())
   {
      SPX_MSG_INFO1(spxout, spxout << "Store basis as old basis (from solver)" << "\n");
      _oldBasisStatusRows = rows;
      _oldBasisStatusCols = cols;
      _hasOldBasis = true;
   }
   else if(_inFeasMode())
   {
      SPX_MSG_INFO1(spxout, spxout << "Store basis as old basis (from solver - testing feasibility)" <<
                    "\n");
      _oldFeasBasisStatusRows = rows;
      _oldFeasBasisStatusCols = cols;
      _hasOldFeasBasis = true;
   }
   else if(_inUnbdMode())
   {
      SPX_MSG_INFO1(spxout, spxout << "Store basis as old basis (from solver - testing unboundedness)" <<
                    "\n");
      _oldUnbdBasisStatusRows = rows;
      _oldUnbdBasisStatusCols = cols;
      _hasOldUnbdBasis = true;
   }
}